

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O0

void __thiscall SQFuncState::AddLineInfos(SQFuncState *this,SQInteger line,bool lineop,bool force)

{
  byte bVar1;
  SQInteger SVar2;
  byte in_CL;
  byte bVar3;
  byte in_DL;
  SQUnsignedInteger in_RSI;
  sqvector<SQLineInfo> *in_RDI;
  SQFuncState *unaff_retaddr;
  SQLineInfo li;
  SQLineInfo *in_stack_ffffffffffffffc8;
  undefined6 in_stack_ffffffffffffffe8;
  SQUnsignedInteger arg0;
  sqvector<SQLineInfo> *psVar4;
  
  bVar3 = in_DL & 1;
  bVar1 = in_CL & 1;
  if ((in_RDI[0x12]._size != in_RSI) || (bVar1 != 0)) {
    arg0 = in_RSI;
    psVar4 = in_RDI;
    SVar2 = GetCurrentPos((SQFuncState *)0x1211c2);
    if ((bVar3 & 1) != 0) {
      AddInstruction(unaff_retaddr,(SQOpcode)((ulong)psVar4 >> 0x20),arg0,
                     CONCAT17(bVar3,CONCAT16(bVar1,in_stack_ffffffffffffffe8)),SVar2 + 1,in_RSI);
    }
    if (in_RDI[0x12]._size != arg0) {
      sqvector<SQLineInfo>::push_back(in_RDI,in_stack_ffffffffffffffc8);
    }
    in_RDI[0x12]._size = arg0;
  }
  return;
}

Assistant:

void SQFuncState::AddLineInfos(SQInteger line,bool lineop,bool force)
{
    if(_lastline!=line || force){
        SQLineInfo li;
        li._line=line;li._op=(GetCurrentPos()+1);
        if(lineop)AddInstruction(_OP_LINE,0,line);
        if(_lastline!=line) {
            _lineinfos.push_back(li);
        }
        _lastline=line;
    }
}